

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestinitiatorFixtureinitiatorResetLogonWithoutResetSeqNumInResponse::
TestinitiatorFixtureinitiatorResetLogonWithoutResetSeqNumInResponse
          (TestinitiatorFixtureinitiatorResetLogonWithoutResetSeqNumInResponse *this)

{
  char *suiteName;
  TestinitiatorFixtureinitiatorResetLogonWithoutResetSeqNumInResponse *this_local;
  
  suiteName = SuiteSessionTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"initiatorResetLogonWithoutResetSeqNumInResponse",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x2d2);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__TestinitiatorFixtureinitiatorResetLogonWithoutResetSeqNumInResponse_00459ef0;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, initiatorResetLogonWithoutResetSeqNumInResponse)
{
  object->setResponder( this );
  object->next();
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  CHECK_EQUAL( 2, object->getExpectedSenderNum() );
  CHECK_EQUAL( 2, object->getExpectedTargetNum() );

  object->next( createLogout( "ISLD", "TW", 2 ), UtcTimeStamp() );
  CHECK_EQUAL( 3, object->getExpectedSenderNum() );
  CHECK_EQUAL( 3, object->getExpectedTargetNum() );

  object->setResetOnLogon( true );
  object->next();
  FIX42::Logon logon = createLogon( "ISLD", "TW", 1 );
  object->next( logon, UtcTimeStamp() );
  CHECK( object->isLoggedOn() );
}